

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O2

void __thiscall kj::parse::anon_unknown_0::TestCase126::run(TestCase126 *this)

{
  IteratorInput<char,_const_char_*> local_20;
  
  local_20.parent = (IteratorInput<char,_const_char_*> *)0x0;
  local_20.end = "";
  local_20.best = "o";
  local_20.pos = "";
  IteratorInput<char,_const_char_*>::~IteratorInput(&local_20);
  return;
}

Assistant:

TEST(CommonParsers, DiscardParser) {
  auto parser = discard(any);

  StringPtr text = "o";
  Input input(text.begin(), text.end());
  Maybe<Tuple<>> result = parser(input);
  EXPECT_TRUE(result != nullptr);
  EXPECT_TRUE(input.atEnd());
}